

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void mcode_protect(jit_State *J,int prot)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_00000008;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 0x9c4) != in_ESI) {
    iVar1 = mcode_setprot((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          in_stack_ffffffffffffffe8,0);
    if (iVar1 != 0) {
      mcode_protfail((jit_State *)CONCAT44(prot,in_stack_00000008));
    }
    *(int *)(in_RDI + 0x9c4) = in_ESI;
  }
  return;
}

Assistant:

static void mcode_protect(jit_State *J, int prot)
{
  if (J->mcprot != prot) {
    if (LJ_UNLIKELY(mcode_setprot(J->mcarea, J->szmcarea, prot)))
      mcode_protfail(J);
    J->mcprot = prot;
  }
}